

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

pair<int,_float> * __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
get_data<directed_flag_complex_coboundary_cell_t>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          directed_flag_complex_coboundary_cell_t *vertices,int offset)

{
  bool bVar1;
  runtime_error *prVar2;
  pointer ppVar3;
  int in_ECX;
  int iVar4;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  iterator pair;
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  _Self local_50;
  vertex_index_t local_42;
  _Self local_40 [2];
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int dimension_00;
  undefined4 in_stack_ffffffffffffffe8;
  pair<int,_float> *local_8;
  
  dimension_00 = (int)((ulong)in_RDX >> 0x20);
  if (in_ESI == 0) {
    local_8 = (pair<int,_float> *)(in_RDI + 4);
  }
  else {
    if (*(long *)(in_RDI + 0x10) == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"A cell could not be found in the directed flag complex.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = in_ECX + 1;
    local_42 = directed_flag_complex_cell_t::operator[]
                         ((directed_flag_complex_cell_t *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (size_t)in_stack_ffffffffffffff58);
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x1c1900);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator==(local_40,&local_50);
    if (bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"A cell could not be found in the directed flag complex.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    directed_flag_complex_coboundary_cell_t::directed_flag_complex_coboundary_cell_t
              ((directed_flag_complex_coboundary_cell_t *)
               CONCAT44(in_ESI + -1,in_stack_ffffffffffffff60),
               (directed_flag_complex_coboundary_cell_t *)&ppVar3->second);
    local_8 = get_data<directed_flag_complex_coboundary_cell_t>
                        ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),dimension_00,
                         (directed_flag_complex_coboundary_cell_t *)
                         CONCAT44(iVar4,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4);
  }
  return local_8;
}

Assistant:

const ExtraData& get_data(int dimension, const Cell vertices, int offset = 0) const {
		if (dimension == 0) return data;

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		return pair->second.get_data(dimension - 1, vertices, offset);
	}